

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<char>::insert(QPodArrayOps<char> *this,qsizetype i,char *data,qsizetype n)

{
  char *__dest;
  GrowthPosition where;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  local_48.size = 0;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<char>).size != 0);
  local_30 = data;
  QArrayDataPointer<char>::detachAndGrow
            (&this->super_QArrayDataPointer<char>,where,n,&local_30,&local_48);
  __dest = createHole(this,where,i,n);
  memcpy(__dest,local_30,n);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, const T *data, qsizetype n)
    {
        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        DataPointer oldData;
        this->detachAndGrow(pos, n, &data, &oldData);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        ::memcpy(static_cast<void *>(where), static_cast<const void *>(data), n * sizeof(T));
    }